

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

int If_DsdObjFindOrAdd(If_DsdMan_t *p,int Type,int *pLits,int nLits,word *pTruth)

{
  byte *pbVar1;
  Vec_Ptr_t *pVVar2;
  Gia_Man_t *p_00;
  Gia_Obj_t *pGVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  Vec_Int_t *pVVar8;
  void **ppvVar9;
  int *piVar10;
  Gia_Obj_t *pGVar11;
  uint *puVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  size_t sVar19;
  uint uVar20;
  ulong uVar21;
  Vec_Int_t *pVVar22;
  
  if (Type == 6) {
    iVar5 = p->vTtMem[nLits]->nEntries;
    iVar4 = Vec_MemHashInsert(p->vTtMem[nLits],pTruth);
    puVar7 = If_DsdObjHashLookup(p,6,pLits,nLits,iVar4);
  }
  else {
    iVar5 = -1;
    puVar7 = If_DsdObjHashLookup(p,Type,pLits,nLits,-1);
    iVar4 = -1;
  }
  if (*puVar7 != 0) {
    return *puVar7;
  }
  if (((-1 < iVar4) && (p->LutSize != 0)) && (iVar4 == p->vTtDecs[nLits]->nSize)) {
    pVVar8 = Dau_DecFindSets_int(pTruth,nLits,p->pSched);
    if (iVar4 != p->vTtMem[nLits]->nEntries + -1) {
      __assert_fail("truthId == Vec_MemEntryNum(p->vTtMem[nLits])-1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                    ,0x3ed,"int If_DsdObjFindOrAdd(If_DsdMan_t *, int, int *, int, word *)");
    }
    pVVar2 = p->vTtDecs[nLits];
    uVar6 = pVVar2->nSize;
    if (uVar6 == pVVar2->nCap) {
      if ((int)uVar6 < 0x10) {
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar9 = (void **)malloc(0x80);
        }
        else {
          ppvVar9 = (void **)realloc(pVVar2->pArray,0x80);
        }
        pVVar2->pArray = ppvVar9;
        pVVar2->nCap = 0x10;
      }
      else {
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar9 = (void **)malloc((ulong)uVar6 << 4);
        }
        else {
          ppvVar9 = (void **)realloc(pVVar2->pArray,(ulong)uVar6 << 4);
        }
        pVVar2->pArray = ppvVar9;
        pVVar2->nCap = uVar6 * 2;
      }
    }
    else {
      ppvVar9 = pVVar2->pArray;
    }
    iVar18 = pVVar2->nSize;
    pVVar2->nSize = iVar18 + 1;
    ppvVar9[iVar18] = pVVar8;
  }
  if ((p->vIsops[nLits] != (Vec_Wec_t *)0x0 && -1 < iVar4) && (iVar5 != p->vTtMem[nLits]->nEntries))
  {
    pVVar8 = Vec_WecPushLevel(p->vIsops[nLits]);
    iVar5 = Kit_TruthIsop((uint *)pTruth,nLits,p->vCover,1);
    if (-1 < iVar5) {
      pVVar22 = p->vCover;
      iVar18 = pVVar22->nSize;
      if ((long)iVar18 < 9) {
        if (pVVar8->nCap < iVar18) {
          sVar19 = (long)iVar18 << 2;
          if (pVVar8->pArray == (int *)0x0) {
            piVar10 = (int *)malloc(sVar19);
          }
          else {
            piVar10 = (int *)realloc(pVVar8->pArray,sVar19);
          }
          pVVar8->pArray = piVar10;
          if (piVar10 == (int *)0x0) goto LAB_003a1f6f;
          pVVar8->nCap = iVar18;
          pVVar22 = p->vCover;
          iVar18 = pVVar22->nSize;
        }
        if (0 < iVar18) {
          lVar17 = 0;
          do {
            Vec_IntPush(pVVar8,pVVar22->pArray[lVar17]);
            lVar17 = lVar17 + 1;
          } while (lVar17 < pVVar22->nSize);
        }
        if (iVar5 != 0) {
          pbVar1 = (byte *)((long)&pVVar8->nCap + 2);
          *pbVar1 = *pbVar1 ^ 1;
        }
      }
    }
    if (p->vIsops[nLits]->nSize != p->vTtMem[nLits]->nEntries) {
      __assert_fail("Vec_WecSize(p->vIsops[nLits]) == Vec_MemEntryNum(p->vTtMem[nLits])",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                    ,0x3fc,"int If_DsdObjFindOrAdd(If_DsdMan_t *, int, int *, int, word *)");
    }
  }
  if ((p->pTtGia != (Gia_Man_t *)0x0 && -1 < iVar4) && (iVar4 == p->vTtMem[nLits]->nEntries + -1)) {
    uVar6 = Kit_TruthToGia(p->pTtGia,(uint *)pTruth,nLits,p->vCover,(Vec_Int_t *)0x0,1);
    if ((int)uVar6 < 0) {
LAB_003a1f31:
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x2ec,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    p_00 = p->pTtGia;
    uVar20 = uVar6 >> 1;
    uVar13 = p_00->nObjs;
    if ((int)uVar13 <= (int)uVar20) goto LAB_003a1f31;
    pGVar11 = p_00->pObjs;
    if ((~*(uint *)(pGVar11 + uVar20) & 0x1fffffff) != 0 && (int)*(uint *)(pGVar11 + uVar20) < 0) {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x2ed,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    if (uVar13 == p_00->nObjsAlloc) {
      uVar14 = uVar13 * 2;
      if (0x1fffffff < (int)(uVar13 * 2)) {
        uVar14 = 0x20000000;
      }
      uVar16 = (ulong)uVar14;
      if (uVar13 == 0x20000000) {
        puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
        exit(1);
      }
      if ((int)uVar14 <= (int)uVar13) {
        __assert_fail("p->nObjs < nObjNew",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x25f,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
      }
      if (p_00->fVerbose == 0) {
LAB_003a1ba0:
        pGVar11 = (Gia_Obj_t *)realloc(pGVar11,uVar16 * 0xc);
        iVar5 = p_00->nObjsAlloc;
      }
      else {
        printf("Extending GIA object storage: %d -> %d.\n");
        iVar5 = p_00->nObjsAlloc;
        if (iVar5 < 1) {
          __assert_fail("p->nObjsAlloc > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x262,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
        }
        pGVar11 = p_00->pObjs;
        if (pGVar11 != (Gia_Obj_t *)0x0) goto LAB_003a1ba0;
        pGVar11 = (Gia_Obj_t *)malloc(uVar16 * 0xc);
      }
      p_00->pObjs = pGVar11;
      memset(pGVar11 + iVar5,0,(long)(int)(uVar14 - iVar5) * 0xc);
      if (p_00->pMuxes != (uint *)0x0) {
        puVar12 = (uint *)realloc(p_00->pMuxes,uVar16 << 2);
        p_00->pMuxes = puVar12;
        memset(puVar12 + p_00->nObjsAlloc,0,(uVar16 - (long)p_00->nObjsAlloc) * 4);
      }
      p_00->nObjsAlloc = uVar14;
      uVar13 = p_00->nObjs;
      p_00->nObjs = uVar13 + 1;
      if ((int)uVar13 < 0) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar11 = p_00->pObjs;
    }
    else {
      p_00->nObjs = uVar13 + 1;
    }
    pGVar11 = pGVar11 + uVar13;
    uVar16 = *(ulong *)pGVar11;
    *(ulong *)pGVar11 = uVar16 | 0x80000000;
    pGVar3 = p_00->pObjs;
    if ((pGVar11 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar11)) {
LAB_003a1f12:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar15 = (ulong)(((uint)((int)pGVar11 - (int)pGVar3) >> 2) * -0x55555555 - uVar20 & 0x1fffffff);
    uVar21 = (ulong)((uVar6 & 1) << 0x1d);
    *(ulong *)pGVar11 = uVar21 | uVar16 & 0xffffffffc0000000 | 0x80000000 | uVar15;
    *(ulong *)pGVar11 =
         uVar21 | uVar16 & 0xe0000000c0000000 | 0x80000000 | uVar15 |
         (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
    pGVar3 = p_00->pObjs;
    if ((pGVar11 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar11)) goto LAB_003a1f12;
    Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * -0x55555555);
    if (p_00->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(p_00,pGVar11 + -(ulong)((uint)*(undefined8 *)pGVar11 & 0x1fffffff),pGVar11);
    }
    if ((pGVar11 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar11)) goto LAB_003a1f12;
  }
  *puVar7 = (p->vObjs).nSize;
  iVar5 = If_DsdObjCreate(p,Type,pLits,nLits,iVar4);
  uVar6 = (p->vObjs).nSize;
  if (p->nBins < (int)uVar6) {
    iVar4 = p->nUniqueMisses;
    uVar13 = p->nBins * 2 - 1;
    while( true ) {
      do {
        uVar14 = uVar13 + 1;
        uVar20 = uVar13 & 1;
        uVar13 = uVar14;
      } while (uVar20 != 0);
      if (uVar14 < 9) break;
      iVar18 = 5;
      while (uVar14 % (iVar18 - 2U) != 0) {
        uVar20 = iVar18 * iVar18;
        iVar18 = iVar18 + 2;
        if (uVar14 < uVar20) goto LAB_003a1da4;
      }
    }
LAB_003a1da4:
    p->nBins = uVar14;
    sVar19 = (long)(int)uVar14 << 2;
    if (p->pBins == (uint *)0x0) {
      puVar7 = (uint *)malloc(sVar19);
    }
    else {
      puVar7 = (uint *)realloc(p->pBins,sVar19);
      sVar19 = (long)p->nBins << 2;
      uVar6 = (p->vObjs).nSize;
    }
    p->pBins = puVar7;
    memset(puVar7,0,sVar19);
    if ((p->vNexts).nCap < (int)uVar6) {
      piVar10 = (p->vNexts).pArray;
      if (piVar10 == (int *)0x0) {
        piVar10 = (int *)malloc((long)(int)uVar6 << 2);
      }
      else {
        piVar10 = (int *)realloc(piVar10,(long)(int)uVar6 << 2);
      }
      (p->vNexts).pArray = piVar10;
      if (piVar10 == (int *)0x0) {
LAB_003a1f6f:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vNexts).nCap = uVar6;
    }
    if (0 < (int)uVar6) {
      memset((p->vNexts).pArray,0,(ulong)uVar6 << 2);
    }
    (p->vNexts).nSize = uVar6;
    iVar18 = (p->vObjs).nSize;
    if (2 < iVar18) {
      lVar17 = 2;
      do {
        puVar7 = (uint *)(p->vObjs).pArray[lVar17];
        uVar6 = puVar7[1];
        iVar18 = -1;
        if (0x17ffffff < uVar6 && (uVar6 & 7) == 6) {
          uVar13 = *puVar7;
          if (((long)(int)uVar13 < 0) || ((p->vTruths).nSize <= (int)uVar13)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar18 = (p->vTruths).pArray[(int)uVar13];
        }
        puVar12 = If_DsdObjHashLookup(p,uVar6 & 7,(int *)(puVar7 + 2),uVar6 >> 0x1b,iVar18);
        if (*puVar12 != 0) {
          __assert_fail("*pSpot == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                        ,0x3b7,"void If_DsdObjHashResize(If_DsdMan_t *)");
        }
        *puVar12 = *puVar7;
        lVar17 = lVar17 + 1;
        iVar18 = (p->vObjs).nSize;
      } while (lVar17 < iVar18);
    }
    if (p->nUniqueMisses - iVar4 != iVar18 + -2) {
      __assert_fail("p->nUniqueMisses - Prev == Vec_PtrSize(&p->vObjs) - 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                    ,0x3ba,"void If_DsdObjHashResize(If_DsdMan_t *)");
    }
    p->nUniqueMisses = iVar4;
  }
  return iVar5;
}

Assistant:

int If_DsdObjFindOrAdd( If_DsdMan_t * p, int Type, int * pLits, int nLits, word * pTruth )
{
    int PrevSize       = (Type == IF_DSD_PRIME) ? Vec_MemEntryNum( p->vTtMem[nLits] ) : -1;   
    int objId, truthId = (Type == IF_DSD_PRIME) ? Vec_MemHashInsert(p->vTtMem[nLits], pTruth) : -1;
    unsigned * pSpot = If_DsdObjHashLookup( p, Type, pLits, nLits, truthId );
//abctime clk;
    if ( *pSpot )
        return (int)*pSpot;
//clk = Abc_Clock();
    if ( p->LutSize && truthId >= 0 && truthId == Vec_PtrSize(p->vTtDecs[nLits]) )
    {
        Vec_Int_t * vSets = Dau_DecFindSets_int( pTruth, nLits, p->pSched );
        assert( truthId == Vec_MemEntryNum(p->vTtMem[nLits])-1 );
        Vec_PtrPush( p->vTtDecs[nLits], vSets );
//        Dau_DecPrintSets( vSets, nLits );
    }
    if ( p->vIsops[nLits] && truthId >= 0 && PrevSize != Vec_MemEntryNum(p->vTtMem[nLits]) )
    {
        Vec_Int_t * vLevel = Vec_WecPushLevel( p->vIsops[nLits] );
        int fCompl = Kit_TruthIsop( (unsigned *)pTruth, nLits, p->vCover, 1 );
        if ( fCompl >= 0 && Vec_IntSize(p->vCover) <= 8 )
        {
            Vec_IntGrow( vLevel, Vec_IntSize(p->vCover) );
            Vec_IntAppend( vLevel, p->vCover );
            if ( fCompl )
                vLevel->nCap ^= (1<<16); // hack to remember complemented attribute
        }
        assert( Vec_WecSize(p->vIsops[nLits]) == Vec_MemEntryNum(p->vTtMem[nLits]) );
    }
    if ( p->pTtGia && truthId >= 0 && truthId == Vec_MemEntryNum(p->vTtMem[nLits])-1 )
    {
//        int nObjOld = Gia_ManAndNum(p->pTtGia);
        int Lit = Kit_TruthToGia( p->pTtGia, (unsigned *)pTruth, nLits, p->vCover, NULL, 1 );
//        printf( "%d ", Gia_ManAndNum(p->pTtGia)-nObjOld );
        Gia_ManAppendCo( p->pTtGia, Lit );
    }
//p->timeCheck += Abc_Clock() - clk;
    *pSpot = Vec_PtrSize( &p->vObjs );
    objId = If_DsdObjCreate( p, Type, pLits, nLits, truthId );
    if ( Vec_PtrSize(&p->vObjs) > p->nBins )
        If_DsdObjHashResize( p );
    return objId;
}